

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int graph_5_4::prim_4(m_graph g)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uStack_30;
  int aiStack_28 [2];
  
  uVar7 = (ulong)(uint)g.vexs[8];
  lVar5 = -(uVar7 * 4 + 0xf & 0xfffffffffffffff0);
  lVar6 = lVar5 + -0x28;
  *(undefined8 *)((long)&uStack_30 + lVar5) = 1;
  for (lVar9 = *(long *)((long)&uStack_30 + lVar5); lVar9 < g.vexs[8]; lVar9 = lVar9 + 1) {
    *(undefined4 *)((long)aiStack_28 + lVar9 * 4 + lVar6 + 0x28) =
         *(undefined4 *)((long)(g.arc + -1) + 0x20 + lVar9 * 4);
  }
  *(undefined8 *)((long)&uStack_30 + lVar5) = 0xffffffffffffffff;
  uVar3 = *(ulong *)((long)&uStack_30 + lVar5);
  *(undefined8 *)((long)&uStack_30 + lVar5) = 1;
  uVar4 = *(ulong *)((long)&uStack_30 + lVar5);
  do {
    iVar10 = 0;
    uVar12 = uVar3 & 0xffffffff;
    for (uVar11 = uVar4; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      iVar1 = *(int *)((long)aiStack_28 + uVar11 * 4 + lVar6 + 0x28);
      if (iVar1 != 0 && iVar1 < (int)uVar12) {
        uVar12 = uVar11 & 0xffffffff;
        iVar10 = (int)uVar11;
      }
      *(undefined4 *)((long)aiStack_28 + (long)iVar10 * 4 + lVar6 + 0x28) = 0;
      for (uVar8 = uVar4; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = *(int *)((long)aiStack_28 + uVar8 * 4 + lVar6 + 0x28);
        if ((iVar1 != 0) && (iVar2 = g.arc[(long)iVar10 + -1][uVar8 + 8], iVar1 < iVar2)) {
          *(int *)((long)aiStack_28 + uVar8 * 4 + lVar6 + 0x28) = iVar2;
        }
      }
    }
  } while( true );
}

Assistant:

int prim_4(m_graph g) {
        int adjvex[g.vnum], dis[g.vnum], min, j, k;
        adjvex[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            adjvex[i] = 0;
            dis[i] = g.arc[0][i];
        }
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[j] != 0 && dis[j] < min) {
                    min = j;
                    k = j;
                }
//                visit(k);
                j++;
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && dis[p] < g.arc[k][p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }